

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitStringEncode(BinaryInstWriter *this,StringEncode *curr)

{
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  U32LEB local_20;
  U32LEB local_1c;
  StringEncode *local_18;
  StringEncode *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (StringEncode *)this;
  bVar2 = wasm::Type::isNull(&curr->str->type);
  if (bVar2) {
    emitUnreachable(this);
  }
  else {
    BufferWithRandomAccess::operator<<(this->o,-5);
    if (local_18->op == StringEncodeLossyUTF8Array) {
      pBVar1 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,0xb6);
      BufferWithRandomAccess::operator<<(pBVar1,local_1c);
    }
    else {
      if (local_18->op != StringEncodeWTF16Array) {
        handle_unreachable("invalid string.new*",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0xa20);
      }
      pBVar1 = this->o;
      LEB<unsigned_int,_unsigned_char>::LEB(&local_20,0xb3);
      BufferWithRandomAccess::operator<<(pBVar1,local_20);
    }
  }
  return;
}

Assistant:

void BinaryInstWriter::visitStringEncode(StringEncode* curr) {
  if (curr->str->type.isNull()) {
    // See visitStringNew.
    emitUnreachable();
    return;
  }
  o << int8_t(BinaryConsts::GCPrefix);
  switch (curr->op) {
    case StringEncodeLossyUTF8Array:
      o << U32LEB(BinaryConsts::StringEncodeLossyUTF8Array);
      break;
    case StringEncodeWTF16Array:
      o << U32LEB(BinaryConsts::StringEncodeWTF16Array);
      break;
    default:
      WASM_UNREACHABLE("invalid string.new*");
  }
}